

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FACT_internal.c
# Opt level: O2

void FACT_INTERNAL_ActivateEvent
               (FACTSoundInstance *sound,FACTTrack *track,FACTTrackInstance *trackInst,
               FACTEvent *evt,FACTEventInstance *evtInst,uint32_t elapsed)

{
  uint16_t uVar1;
  ushort uVar2;
  FACTCue *pFVar3;
  uint uVar4;
  byte bVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  bool bVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  double dVar13;
  float fVar14;
  
  switch(evt->type) {
  case 0:
    bVar5 = (evt->field_3).wave.flags;
    if ((bVar5 & 2) == 0) {
      FACT_INTERNAL_StopTrack(track,trackInst,bVar5 & 1);
    }
    else {
      if ((bVar5 & 1) == 0) {
        pFVar3 = sound->parentCue;
        uVar1 = pFVar3->parentBank->cues[pFVar3->index].fadeOutMS;
        if (uVar1 != 0) {
          FACT_INTERNAL_BeginFadeOut(sound,uVar1);
          break;
        }
        if (pFVar3->maxRpcReleaseTime != 0) {
          FACT_INTERNAL_BeginReleaseRPC(sound,(uint16_t)pFVar3->maxRpcReleaseTime);
          break;
        }
      }
      lVar7 = 0;
      lVar8 = 0;
      for (uVar6 = 0; uVar6 < sound->sound->trackCount; uVar6 = uVar6 + 1) {
        FACT_INTERNAL_StopTrack
                  ((FACTTrack *)((long)&sound->sound->tracks->code + lVar8),
                   (FACTTrackInstance *)((long)&sound->tracks->events + lVar7),'\x01');
        lVar8 = lVar8 + 0x28;
        lVar7 = lVar7 + 0x68;
      }
    }
    break;
  case 1:
  case 3:
  case 4:
  case 6:
    SDL_memcpy(&trackInst->activeWave,&trackInst->upcomingWave,0x18);
    (trackInst->upcomingWave).wave = (FACTWave *)0x0;
    FACTWave_Play((trackInst->activeWave).wave);
    break;
  case 7:
  case 8:
  case 0x10:
  case 0x11:
    if (((evt->field_3).wave.flags & 1) == 0) {
      bVar5 = *(byte *)((long)&evt->field_3 + 8);
      if ((bVar5 & 4) == 0) {
        fVar10 = 0.0;
        if ((bVar5 & 8) != 0) {
          fVar10 = *(float *)((long)&evt->field_3 + 0xc);
          dVar13 = stb_frand();
          fVar10 = (*(float *)((long)&evt->field_3 + 0x10) - *(float *)((long)&evt->field_3 + 0xc))
                   * (float)dVar13 + fVar10;
          bVar5 = *(byte *)((long)&evt->field_3 + 8);
        }
      }
      else {
        fVar10 = *(float *)((long)&evt->field_3 + 0xc);
      }
      bVar9 = true;
      if ((bVar5 & 1) != 0) {
        if ((evt->type == 0x10) || (evt->type == 7)) {
          fVar10 = fVar10 + trackInst->evtPitch;
        }
        else {
          fVar10 = fVar10 + trackInst->evtVolume;
        }
      }
    }
    else {
      uVar4 = (uint)*(ushort *)((long)&evt->field_3 + 0x14);
      fVar11 = (float)uVar4;
      bVar9 = evtInst->timestamp + uVar4 < elapsed;
      fVar10 = *(float *)((long)&evt->field_3 + 8);
      fVar14 = (float)(elapsed - evtInst->timestamp) / fVar11;
      fVar12 = 1.0;
      if (fVar14 <= 1.0) {
        fVar12 = fVar14;
      }
      fVar10 = fVar12 * ((((*(float *)((long)&evt->field_3 + 0xc) * fVar11) / 1000.0) * 10.0 +
                         fVar10) - fVar10) + fVar10;
    }
    (evtInst->field_3).value = fVar10;
    if ((evt->type == 0x10) || (evt->type == 7)) {
      trackInst->evtPitch = fVar10;
    }
    else {
      trackInst->evtVolume = fVar10;
    }
    if (!bVar9) {
      return;
    }
    uVar1 = evtInst->loopCount;
    if (uVar1 != 0) {
      if ((uVar1 != 0xff) && (uVar1 != 0xffff)) {
        evtInst->loopCount = uVar1 - 1;
      }
      uVar2 = (evt->field_3).wave.angle;
LAB_0010e5d7:
      evtInst->timestamp = evtInst->timestamp + (uint)uVar2;
      return;
    }
    break;
  case 9:
  case 0x12:
    uVar1 = evtInst->loopCount;
    if (uVar1 != 0) {
      if (uVar1 != 0xff) {
        evtInst->loopCount = uVar1 - 1;
      }
      uVar2 = (evt->field_3).marker.frequency;
      goto LAB_0010e5d7;
    }
  }
  evtInst->finished = '\x01';
  return;
}

Assistant:

void FACT_INTERNAL_ActivateEvent(
	FACTSoundInstance *sound,
	FACTTrack *track,
	FACTTrackInstance *trackInst,
	FACTEvent *evt,
	FACTEventInstance *evtInst,
	uint32_t elapsed
) {
	uint8_t i;
	float svResult;
	uint8_t skipLoopCheck = 0;

	/* STOP */
	if (evt->type == FACTEVENT_STOP)
	{
		/* Stop Cue */
		if (evt->stop.flags & 0x02)
		{
			if (	evt->stop.flags & 0x01 ||
				(	sound->parentCue->parentBank->cues[sound->parentCue->index].fadeOutMS == 0 &&
					sound->parentCue->maxRpcReleaseTime == 0	)	)
			{
				for (i = 0; i < sound->sound->trackCount; i += 1)
				{
					FACT_INTERNAL_StopTrack(
						&sound->sound->tracks[i],
						&sound->tracks[i],
						1
					);
				}
			}
			else
			{
				if (sound->parentCue->parentBank->cues[sound->parentCue->index].fadeOutMS > 0)
				{
					FACT_INTERNAL_BeginFadeOut(
						sound,
						sound->parentCue->parentBank->cues[sound->parentCue->index].fadeOutMS
					);
				}
				else if (sound->parentCue->maxRpcReleaseTime > 0)
				{
					FACT_INTERNAL_BeginReleaseRPC(
						sound,
						sound->parentCue->maxRpcReleaseTime
					);
				}
				else
				{
					/* Pretty sure this doesn't happen, but just in case? */
					sound->parentCue->state |= FACT_STATE_STOPPING;
				}
			}
		}

		/* Stop track */
		else
		{
			FACT_INTERNAL_StopTrack(
				track,
				trackInst,
				evt->stop.flags & 0x01
			);
		}
	}

	/* PLAYWAVE */
	else if (	evt->type == FACTEVENT_PLAYWAVE ||
			evt->type == FACTEVENT_PLAYWAVETRACKVARIATION ||
			evt->type == FACTEVENT_PLAYWAVEEFFECTVARIATION ||
			evt->type == FACTEVENT_PLAYWAVETRACKEFFECTVARIATION	)
	{
		FAudio_assert(trackInst->activeWave.wave == NULL);
		FAudio_assert(trackInst->upcomingWave.wave != NULL);
		FAudio_memcpy(
			&trackInst->activeWave,
			&trackInst->upcomingWave,
			sizeof(trackInst->activeWave)
		);
		trackInst->upcomingWave.wave = NULL;
		FACTWave_Play(trackInst->activeWave.wave);
	}

	/* SETVALUE */
	else if (	evt->type == FACTEVENT_PITCH ||
			evt->type == FACTEVENT_PITCHREPEATING ||
			evt->type == FACTEVENT_VOLUME ||
			evt->type == FACTEVENT_VOLUMEREPEATING	)
	{
		/* Ramp/Equation */
		if (evt->value.settings & 0x01)
		{
			/* FIXME: Incorporate 2nd derivative into the interpolated pitch (slopeDelta) */
			skipLoopCheck = elapsed <= (evtInst->timestamp + evt->value.ramp.duration);
			svResult = (
				evt->value.ramp.initialSlope *
				evt->value.ramp.duration / 1000 *
				10 /* "Slices" */
			) + evt->value.ramp.initialValue;
			svResult = (
				(svResult - evt->value.ramp.initialValue)
			) * FAudio_clamp(
				(float) (elapsed - evtInst->timestamp) / evt->value.ramp.duration,
				0.0f,
				1.0f
			) + evt->value.ramp.initialValue;

			evtInst->value = svResult;
		}
		else
		{
			/* Value/Random */
			if (evt->value.equation.flags & 0x04)
			{
				svResult = evt->value.equation.value1;
			}
			else if (evt->value.equation.flags & 0x08)
			{
				svResult = evt->value.equation.value1 + FACT_INTERNAL_rng() * (
					evt->value.equation.value2 -
					evt->value.equation.value1
				);
			}
			else
			{
				svResult = 0.0f;
				FAudio_assert(0 && "Equation flags?");
			}

			/* Add/Replace */
			if (evt->value.equation.flags & 0x01)
			{
				if(	evt->type == FACTEVENT_PITCH ||
					evt->type == FACTEVENT_PITCHREPEATING	)
				{
					evtInst->value = trackInst->evtPitch + svResult;
				}
				else
				{
					evtInst->value = trackInst->evtVolume + svResult;
				}
			}
			else
			{
				evtInst->value = svResult;
			}
		}

		/* Set the result, finally. */
		if (	evt->type == FACTEVENT_PITCH ||
			evt->type == FACTEVENT_PITCHREPEATING	)
		{
			trackInst->evtPitch = evtInst->value;
		}
		else
		{
			trackInst->evtVolume = evtInst->value;
		}

		if (skipLoopCheck)
		{
			return;
		}
		if (evtInst->loopCount > 0)
		{
			if (evtInst->loopCount != 0xFF && evtInst->loopCount != 0xFFFF)
			{
				evtInst->loopCount -= 1;
			}

			evtInst->timestamp += evt->value.frequency;
			return;
		}
	}

	/* MARKER */
	else if (	evt->type == FACTEVENT_MARKER ||
			evt->type == FACTEVENT_MARKERREPEATING	)
	{
		/* TODO: FACT_INTERNAL_Marker(evt->marker*) */
		if (evtInst->loopCount > 0)
		{
			if (evtInst->loopCount != 0xFF)
			{
				evtInst->loopCount -= 1;
			}

			evtInst->timestamp += evt->marker.frequency;
			return;
		}
	}

	/* ??? */
	else
	{
		FAudio_assert(0 && "Unknown event type!");
	}

	/* If we made it here, we're done! */
	evtInst->finished = 1;
}